

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BondOrderParameter.cpp
# Opt level: O1

void __thiscall OpenMD::BondOrderParameter::process(BondOrderParameter *this)

{
  key_type *pkVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  char cVar5;
  SimInfo *info;
  pointer pdVar6;
  undefined1 auVar7 [16];
  BondOrderParameter *this_00;
  pointer pcVar8;
  uint i_1;
  StuntDouble *pSVar9;
  mapped_type *pmVar10;
  Molecule *pMVar11;
  Atom *pAVar12;
  long lVar13;
  mapped_type *pmVar14;
  uint *puVar15;
  mapped_type *pmVar16;
  int iVar17;
  long lVar18;
  int iVar19;
  key_type kVar20;
  map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  *pmVar21;
  uint uVar22;
  pointer ppAVar23;
  int iVar24;
  ulong uVar25;
  int mmm;
  ulong uVar26;
  int mmm_1;
  double tmp;
  double dVar27;
  undefined8 extraout_XMM0_Qa;
  pointer extraout_XMM0_Qb;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined8 uVar31;
  int i;
  vector<double,_std::allocator<double>_> Q2;
  vector<double,_std::allocator<double>_> q2;
  pair<int,_int> lm;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> W;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> w;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> W_hat;
  vector<double,_std::allocator<double>_> Q;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> w_hat;
  vector<double,_std::allocator<double>_> q_l;
  Vector3d vec;
  MoleculeIterator mi;
  SphericalHarmonic sphericalHarmonic;
  map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
  QBar;
  map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
  q;
  DumpReader reader;
  uint local_158c;
  SelectionSet local_1588;
  double local_1570;
  int local_1568;
  int iStack_1564;
  pointer pOStack_1560;
  int local_154c;
  StuntDouble *local_1548;
  map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  *local_1540;
  map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  *local_1538;
  int local_152c;
  int local_1528;
  uint local_1524;
  BondOrderParameter *local_1520;
  map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  *local_1518;
  map<std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>_>_>_>
  *local_1510;
  key_type local_1508;
  int local_14fc;
  vector<double,_std::allocator<double>_> local_14f8;
  vector<double,_std::allocator<double>_> local_14d8;
  pointer local_14b8;
  pointer ppAStack_14b0;
  key_type local_14a8 [4];
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_1488;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_1468;
  double local_1448;
  undefined8 uStack_1440;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_1438;
  vector<double,_std::allocator<double>_> local_1418;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_13f8;
  vector<double,_std::allocator<double>_> local_13d8;
  Vector3d local_13b8;
  SelectionManager *local_1398;
  MoleculeIterator local_1390;
  key_type local_1388 [4];
  SelectionEvaluator *local_1368;
  ulong local_1360;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_1358;
  vector<double,_std::allocator<double>_> local_1340;
  vector<double,_std::allocator<double>_> local_1328;
  SphericalHarmonic local_1310;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_1300;
  _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_std::complex<double>_>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
  local_12e8;
  _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_std::complex<double>_>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
  local_12b8;
  DumpReader local_1288;
  
  local_1390._M_node = (_Base_ptr)0x0;
  local_13b8.super_Vector<double,_3U>.data_[2] = 0.0;
  local_13b8.super_Vector<double,_3U>.data_[0] = 0.0;
  local_13b8.super_Vector<double,_3U>.data_[1] = 0.0;
  local_12b8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_12b8._M_impl.super__Rb_tree_header._M_header;
  local_12b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_12b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_12b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_13d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_13d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_13d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_14d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_14d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_14d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1468.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1468.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1468.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_13f8.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_13f8.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_13f8.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_12e8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_12e8._M_impl.super__Rb_tree_header._M_header;
  local_12e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_12e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_12e8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_14f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_14f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_14f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1418.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1418.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1418.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1488.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1488.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1488.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1438.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1438.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1438.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_12e8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_12e8._M_impl.super__Rb_tree_header._M_header._M_left;
  local_12b8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_12b8._M_impl.super__Rb_tree_header._M_header._M_left;
  SphericalHarmonic::SphericalHarmonic(&local_1310);
  info = (this->super_StaticAnalyser).info_;
  cVar5 = (info->simParams_->UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b;
  DumpReader::DumpReader(&local_1288,info,&(this->super_StaticAnalyser).dumpFilename_);
  local_1528 = DumpReader::getNFrames(&local_1288);
  this->frameCounter_ = 0;
  std::vector<double,_std::allocator<double>_>::resize(&local_13d8,0xd);
  std::vector<double,_std::allocator<double>_>::resize(&local_14d8,0xd);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize(&local_1468,0xd)
  ;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize(&local_13f8,0xd)
  ;
  std::vector<double,_std::allocator<double>_>::resize(&local_14f8,0xd);
  std::vector<double,_std::allocator<double>_>::resize(&local_1418,0xd);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize(&local_1488,0xd)
  ;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize(&local_1438,0xd)
  ;
  local_1520 = this;
  if (local_1528 < 1) {
    pOStack_1560 = (pointer)0x0;
  }
  else {
    local_1368 = &this->evaluator_;
    local_1398 = &this->seleMan_;
    local_1518 = &this->m2Max;
    local_1538 = &this->m2Min;
    local_1510 = &this->w3j;
    uVar26 = 0;
    local_152c = 0;
    do {
      DumpReader::readFrame(&local_1288,(int)uVar26);
      this->frameCounter_ = this->frameCounter_ + 1;
      this->currentSnapshot_ = ((this->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
      if ((this->evaluator_).isDynamic_ == true) {
        SelectionEvaluator::evaluate(&local_1588,local_1368);
        lVar18 = 0;
        do {
          std::vector<bool,_std::allocator<bool>_>::operator=
                    ((vector<bool,_std::allocator<bool>_> *)
                     ((long)&(((this->seleMan_).ss_.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                     lVar18),(vector<bool,_std::allocator<bool>_> *)
                             ((long)local_1588.bitsets_.
                                    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar18));
          lVar18 = lVar18 + 0x28;
        } while (lVar18 != 0xf0);
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                  (&local_1588.bitsets_);
      }
      pSVar9 = SelectionManager::beginSelected(local_1398,&local_14fc);
      local_1360 = uVar26;
      while (pSVar9 != (StuntDouble *)0x0) {
        iVar24 = pSVar9->globalIndex_;
        iVar17 = 1;
        uVar26 = 0;
        local_1548 = pSVar9;
        do {
          uVar22 = -(int)uVar26;
          iVar19 = iVar17;
          do {
            local_1588.bitsets_.
            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)((ulong)uVar22 << 0x20 | uVar26);
            pmVar10 = std::
                      map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                      ::operator[]((map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                                    *)&local_12b8,(key_type *)&local_1588);
            *(undefined8 *)pmVar10->_M_value = 0;
            *(undefined8 *)(pmVar10->_M_value + 8) = 0;
            uVar22 = uVar22 + 1;
            iVar19 = iVar19 + -1;
          } while (iVar19 != 0);
          uVar26 = uVar26 + 1;
          iVar17 = iVar17 + 2;
        } while (uVar26 != 0xd);
        pMVar11 = SimInfo::beginMolecule((this->super_StaticAnalyser).info_,&local_1390);
        local_154c = 0;
        pSVar9 = local_1548;
        while (pMVar11 != (Molecule *)0x0) {
          ppAVar23 = (pMVar11->atoms_).
                     super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          while( true ) {
            if (ppAVar23 ==
                (pMVar11->atoms_).
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              pAVar12 = (Atom *)0x0;
            }
            else {
              pAVar12 = *ppAVar23;
            }
            if (pAVar12 == (Atom *)0x0) break;
            if ((pAVar12->super_StuntDouble).globalIndex_ != iVar24) {
              lVar18 = *(long *)((long)&(pSVar9->snapshotMan_->currentSnapshot_->atomData).position.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + pSVar9->storage_
                                );
              local_14a8[2] =
                   (key_type)*(undefined8 *)(lVar18 + 0x10 + (long)pSVar9->localIndex_ * 0x18);
              pkVar1 = (key_type *)(lVar18 + (long)pSVar9->localIndex_ * 0x18);
              local_14a8[0] = *pkVar1;
              local_14a8[1] = pkVar1[1];
              lVar13 = (long)(pAVar12->super_StuntDouble).localIndex_;
              lVar18 = *(long *)((long)&(((pAVar12->super_StuntDouble).snapshotMan_)->
                                         currentSnapshot_->atomData).position.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                (pAVar12->super_StuntDouble).storage_);
              local_1388[2] = (key_type)*(undefined8 *)(lVar18 + 0x10 + lVar13 * 0x18);
              pkVar1 = (key_type *)(lVar18 + lVar13 * 0x18);
              local_1388[0] = *pkVar1;
              local_1388[1] = pkVar1[1];
              local_1588.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_1588.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_1588.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              lVar18 = 0;
              do {
                (&local_1588.bitsets_.
                  super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                  _M_impl.super__Vector_impl_data._M_start)[lVar18] =
                     (pointer)((double)local_14a8[lVar18] - (double)local_1388[lVar18]);
                lVar18 = lVar18 + 1;
              } while (lVar18 != 3);
              local_13b8.super_Vector<double,_3U>.data_[2] =
                   (double)local_1588.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_13b8.super_Vector<double,_3U>.data_[0] =
                   (double)local_1588.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              local_13b8.super_Vector<double,_3U>.data_[1] =
                   (double)local_1588.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
              if (cVar5 != '\0') {
                Snapshot::wrapVector(this->currentSnapshot_,&local_13b8);
              }
              dVar27 = 0.0;
              lVar18 = 0;
              do {
                dVar4 = local_13b8.super_Vector<double,_3U>.data_[lVar18];
                dVar27 = dVar27 + dVar4 * dVar4;
                lVar18 = lVar18 + 1;
              } while (lVar18 != 3);
              if (dVar27 < 0.0) {
                dVar27 = sqrt(dVar27);
              }
              else {
                dVar27 = SQRT(dVar27);
              }
              if (dVar27 < this->rCut_) {
                local_1570 = local_13b8.super_Vector<double,_3U>.data_[2] / dVar27;
                local_14b8 = ppAVar23;
                local_1540 = (map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                              *)atan2(local_13b8.super_Vector<double,_3U>.data_[1],
                                      local_13b8.super_Vector<double,_3U>.data_[0]);
                iVar17 = 1;
                uVar26 = 0;
                do {
                  local_1310.L = (int)uVar26;
                  uVar22 = -local_1310.L;
                  iVar19 = iVar17;
                  do {
                    uVar31 = 0;
                    pmVar21 = local_1540;
                    local_1310.M = uVar22;
                    SphericalHarmonic::getValueAt(&local_1310,local_1570,(RealType)local_1540);
                    local_1568 = (int)extraout_XMM0_Qa;
                    iStack_1564 = (int)((ulong)extraout_XMM0_Qa >> 0x20);
                    local_1588.bitsets_.
                    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                    _M_impl.super__Vector_impl_data._M_start =
                         (pointer)((ulong)uVar22 << 0x20 | uVar26);
                    pOStack_1560 = extraout_XMM0_Qb;
                    local_1448 = (double)pmVar21;
                    uStack_1440 = uVar31;
                    pmVar10 = std::
                              map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                              ::operator[]((map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                                            *)&local_12b8,(key_type *)&local_1588);
                    dVar27 = *(double *)(pmVar10->_M_value + 8);
                    *(double *)pmVar10->_M_value =
                         (double)CONCAT44(iStack_1564,local_1568) + *(double *)pmVar10->_M_value;
                    *(double *)(pmVar10->_M_value + 8) = local_1448 + dVar27;
                    uVar22 = uVar22 + 1;
                    iVar19 = iVar19 + -1;
                  } while (iVar19 != 0);
                  uVar26 = uVar26 + 1;
                  iVar17 = iVar17 + 2;
                } while (uVar26 != 0xd);
                local_154c = local_154c + 1;
                pSVar9 = local_1548;
                ppAVar23 = local_14b8;
                this = local_1520;
              }
            }
            ppAVar23 = ppAVar23 + 1;
          }
          pMVar11 = SimInfo::nextMolecule((this->super_StaticAnalyser).info_,&local_1390);
        }
        local_14b8 = (pointer)(double)local_154c;
        iVar24 = 1;
        uVar26 = 0;
        ppAStack_14b0 = local_14b8;
        do {
          local_14d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar26] = 0.0;
          uVar22 = -(int)uVar26;
          local_1568 = iVar24;
          do {
            kVar20 = (key_type)((ulong)uVar22 << 0x20 | uVar26);
            local_1588.bitsets_.
            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)kVar20;
            pmVar10 = std::
                      map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                      ::operator[]((map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                                    *)&local_12b8,(key_type *)&local_1588);
            auVar7._8_8_ = ppAStack_14b0;
            auVar7._0_8_ = local_14b8;
            auVar28 = divpd(*(undefined1 (*) [16])pmVar10->_M_value,auVar7);
            *(undefined1 (*) [16])pmVar10->_M_value = auVar28;
            local_1588.bitsets_.
            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)kVar20;
            pmVar10 = std::
                      map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                      ::operator[]((map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                                    *)&local_12b8,(key_type *)&local_1588);
            local_14d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar26] =
                 *(double *)pmVar10->_M_value * *(double *)pmVar10->_M_value +
                 *(double *)(pmVar10->_M_value + 8) * *(double *)(pmVar10->_M_value + 8) +
                 local_14d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar26];
            uVar22 = uVar22 + 1;
            iVar24 = iVar24 + -1;
          } while (iVar24 != 0);
          dVar27 = (local_14d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar26] * 4.0 * 3.141592653589793) /
                   (double)((int)uVar26 * 2 + 1);
          if (dVar27 < 0.0) {
            dVar27 = sqrt(dVar27);
          }
          else {
            dVar27 = SQRT(dVar27);
          }
          local_13d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar26] = dVar27;
          uVar26 = uVar26 + 1;
          iVar24 = local_1568 + 2;
        } while (uVar26 != 0xd);
        local_1524 = 1;
        dVar27 = 0.0;
        pmVar21 = local_1538;
        do {
          local_1540 = (map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                        *)((long)dVar27 * 0x10);
          *(undefined8 *)
           local_1468.
           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
           super__Vector_impl_data._M_start[(long)dVar27]._M_value = 0;
          *(undefined8 *)
           ((long)local_1468.
                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_start[(long)dVar27]._M_value + 8) = 0;
          uVar22 = -SUB84(dVar27,0);
          uVar26 = (ulong)dVar27 & 0xffffffff;
          local_1570 = dVar27;
          do {
            local_1548 = (StuntDouble *)(ulong)uVar22;
            local_14a8[0] = (key_type)((long)local_1548 << 0x20 | (ulong)local_1570);
            iVar24 = (int)uVar26;
            lVar18 = 0;
            while( true ) {
              pmVar14 = std::
                        map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                        ::operator[](local_1518,local_14a8);
              iVar17 = *pmVar14;
              pmVar14 = std::
                        map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                        ::operator[](pmVar21,local_14a8);
              pcVar8 = local_1468.
                       super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              dVar27 = local_1570;
              if ((long)iVar17 - (long)*pmVar14 < lVar18) break;
              puVar15 = (uint *)std::
                                map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                                ::operator[](pmVar21,local_14a8);
              uVar22 = *puVar15;
              pmVar16 = std::
                        map<std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>_>_>_>
                        ::operator[](local_1510,local_14a8);
              pdVar6 = (pmVar16->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              pmVar10 = std::
                        map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                        ::operator[]((map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                                      *)&local_12b8,local_14a8);
              dVar27 = local_1570;
              pOStack_1560 = *(pointer *)(pmVar10->_M_value + 8);
              local_1568 = (int)*(undefined8 *)pmVar10->_M_value;
              iStack_1564 = (int)((ulong)*(undefined8 *)pmVar10->_M_value >> 0x20);
              local_1448 = pdVar6[lVar18];
              uStack_1440 = 0;
              local_1388[0] = (key_type)(lVar18 + (ulong)uVar22 << 0x20 | (ulong)local_1570);
              pmVar10 = std::
                        map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                        ::operator[]((map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                                      *)&local_12b8,local_1388);
              local_1588.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   (pointer)((double)CONCAT44(iStack_1564,local_1568) * local_1448);
              local_1588.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   (pointer)((double)pOStack_1560 * local_1448);
              std::complex<double>::operator*=((complex<double> *)&local_1588,pmVar10);
              local_1568 = (int)local_1588.bitsets_.
                                super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                ._M_impl.super__Vector_impl_data._M_start;
              iStack_1564 = (int)((ulong)local_1588.bitsets_.
                                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 0x20);
              pOStack_1560 = local_1588.bitsets_.
                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
              local_1508 = (key_type)((ulong)((int)uVar26 - uVar22) << 0x20 | (ulong)dVar27);
              pmVar10 = std::
                        map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                        ::operator[]((map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                                      *)&local_12b8,&local_1508);
              local_1588.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start._4_4_ = iStack_1564;
              local_1588.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start._0_4_ = local_1568;
              local_1588.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish = pOStack_1560;
              std::complex<double>::operator*=((complex<double> *)&local_1588,pmVar10);
              pdVar2 = (double *)
                       ((long)(local_1468.
                               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_value +
                       (long)local_1540);
              dVar27 = pdVar2[1];
              pdVar3 = (double *)
                       ((long)(local_1468.
                               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_value +
                       (long)local_1540);
              *pdVar3 = *pdVar2 + (double)local_1588.bitsets_.
                                          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                          ._M_impl.super__Vector_impl_data._M_start;
              pdVar3[1] = dVar27 + (double)local_1588.bitsets_.
                                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                           ._M_impl.super__Vector_impl_data._M_finish;
              lVar18 = lVar18 + 1;
              uVar26 = (ulong)((int)uVar26 - 1);
              pmVar21 = local_1538;
            }
            uVar22 = (int)local_1548 + 1;
            uVar26 = (ulong)(iVar24 - 1);
          } while (uVar22 != local_1524);
          auVar29._0_8_ =
               pow(local_14d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[(long)local_1570],1.5);
          auVar29._8_8_ = auVar29._0_8_;
          auVar28 = divpd(*(undefined1 (*) [16])((long)pcVar8->_M_value + (long)local_1540),auVar29)
          ;
          *(undefined1 (*) [16])
           ((long)(local_13f8.
                   super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_start)->_M_value + (long)local_1540) = auVar28
          ;
          dVar27 = (double)((long)dVar27 + 1);
          local_1524 = local_1524 + 1;
        } while (dVar27 != 6.42285339593621e-323);
        std::vector<double,_std::allocator<double>_>::vector(&local_1328,&local_13d8);
        this = local_1520;
        std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
                  (&local_1300,&local_13f8);
        (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[5])(this,&local_1328,&local_1300);
        if (local_1300.
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1300.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1300.
                                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1300.
                                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1328.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1328.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        local_152c = local_152c + local_154c;
        iVar24 = 1;
        uVar26 = 0;
        do {
          uVar22 = -(int)uVar26;
          iVar17 = iVar24;
          do {
            kVar20 = (key_type)((ulong)uVar22 << 0x20 | uVar26);
            local_1588.bitsets_.
            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)kVar20;
            pmVar10 = std::
                      map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                      ::operator[]((map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                                    *)&local_12b8,(key_type *)&local_1588);
            pOStack_1560 = *(pointer *)(pmVar10->_M_value + 8);
            local_1568 = (int)*(undefined8 *)pmVar10->_M_value;
            iStack_1564 = (int)((ulong)*(undefined8 *)pmVar10->_M_value >> 0x20);
            local_14a8[0] = kVar20;
            pmVar10 = std::
                      map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                      ::operator[]((map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                                    *)&local_12e8,local_14a8);
            dVar27 = *(double *)(pmVar10->_M_value + 8);
            *(double *)pmVar10->_M_value =
                 *(double *)pmVar10->_M_value +
                 (double)CONCAT44(iStack_1564,local_1568) * (double)local_14b8;
            *(double *)(pmVar10->_M_value + 8) =
                 dVar27 + (double)pOStack_1560 * (double)ppAStack_14b0;
            uVar22 = uVar22 + 1;
            iVar17 = iVar17 + -1;
          } while (iVar17 != 0);
          uVar26 = uVar26 + 1;
          iVar24 = iVar24 + 2;
        } while (uVar26 != 0xd);
        pSVar9 = SelectionManager::nextSelected(local_1398,&local_14fc);
      }
      uVar22 = (int)local_1360 + (this->super_StaticAnalyser).step_;
      uVar26 = (ulong)uVar22;
    } while ((int)uVar22 < local_1528);
    pOStack_1560 = (pointer)(double)local_152c;
  }
  iVar24 = 1;
  uVar26 = 0;
  local_1568 = (int)pOStack_1560;
  iStack_1564 = (int)((ulong)pOStack_1560 >> 0x20);
  do {
    uVar22 = -(int)uVar26;
    iVar17 = iVar24;
    do {
      local_1588.bitsets_.
      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)((ulong)uVar22 << 0x20 | uVar26);
      pmVar10 = std::
                map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                ::operator[]((map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                              *)&local_12e8,(key_type *)&local_1588);
      auVar28._4_4_ = iStack_1564;
      auVar28._0_4_ = local_1568;
      auVar28._8_8_ = pOStack_1560;
      auVar28 = divpd(*(undefined1 (*) [16])pmVar10->_M_value,auVar28);
      *(undefined1 (*) [16])pmVar10->_M_value = auVar28;
      uVar22 = uVar22 + 1;
      iVar17 = iVar17 + -1;
    } while (iVar17 != 0);
    uVar26 = uVar26 + 1;
    iVar24 = iVar24 + 2;
  } while (uVar26 != 0xd);
  iVar24 = 1;
  uVar26 = 0;
  do {
    local_14f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar26] = 0.0;
    uVar22 = -(int)uVar26;
    iVar17 = iVar24;
    do {
      local_1588.bitsets_.
      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)((ulong)uVar22 << 0x20 | uVar26);
      pmVar10 = std::
                map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                ::operator[]((map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                              *)&local_12e8,(key_type *)&local_1588);
      local_14f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start[uVar26] =
           *(double *)pmVar10->_M_value * *(double *)pmVar10->_M_value +
           *(double *)(pmVar10->_M_value + 8) * *(double *)(pmVar10->_M_value + 8) +
           local_14f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar26];
      uVar22 = uVar22 + 1;
      iVar17 = iVar17 + -1;
    } while (iVar17 != 0);
    dVar27 = (local_14f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar26] * 4.0 * 3.141592653589793) /
             (double)((int)uVar26 * 2 + 1);
    if (dVar27 < 0.0) {
      dVar27 = sqrt(dVar27);
    }
    else {
      dVar27 = SQRT(dVar27);
    }
    local_1418.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar26] = dVar27;
    uVar26 = uVar26 + 1;
    iVar24 = iVar24 + 2;
  } while (uVar26 != 0xd);
  local_1540 = &local_1520->m2Max;
  pmVar21 = &local_1520->m2Min;
  local_1538 = (map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                *)&local_1520->w3j;
  local_158c = 1;
  uVar26 = 0;
  local_1510 = (map<std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>_>_>_>
                *)pmVar21;
  do {
    local_1518 = (map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                  *)(uVar26 * 0x10);
    *(undefined8 *)
     local_1488.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
     _M_impl.super__Vector_impl_data._M_start[uVar26]._M_value = 0;
    *(undefined8 *)
     ((long)local_1488.
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
            .super__Vector_impl_data._M_start[uVar26]._M_value + 8) = 0;
    uVar22 = -(int)uVar26;
    uVar25 = uVar26 & 0xffffffff;
    local_1570 = (double)uVar26;
    do {
      local_14b8 = (pointer)(ulong)uVar22;
      local_14a8[0] = (key_type)((long)local_14b8 << 0x20 | (ulong)local_1570);
      local_1548 = (StuntDouble *)CONCAT44(local_1548._4_4_,(int)uVar25);
      lVar18 = 0;
      while( true ) {
        pmVar14 = std::
                  map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                  ::operator[](local_1540,local_14a8);
        iVar24 = *pmVar14;
        pmVar14 = std::
                  map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                  ::operator[](pmVar21,local_14a8);
        pcVar8 = local_1488.
                 super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if ((long)iVar24 - (long)*pmVar14 < lVar18) break;
        puVar15 = (uint *)std::
                          map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                          ::operator[](pmVar21,local_14a8);
        uVar22 = *puVar15;
        pmVar16 = std::
                  map<std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>_>_>_>
                  ::operator[]((map<std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>_>_>_>
                                *)local_1538,local_14a8);
        pdVar6 = (pmVar16->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pmVar10 = std::
                  map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                  ::operator[]((map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                                *)&local_12e8,local_14a8);
        dVar27 = local_1570;
        pOStack_1560 = *(pointer *)(pmVar10->_M_value + 8);
        local_1568 = (int)*(undefined8 *)pmVar10->_M_value;
        iStack_1564 = (int)((ulong)*(undefined8 *)pmVar10->_M_value >> 0x20);
        local_1448 = pdVar6[lVar18];
        uStack_1440 = 0;
        local_1388[0] = (key_type)(lVar18 + (ulong)uVar22 << 0x20 | (ulong)local_1570);
        pmVar10 = std::
                  map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                  ::operator[]((map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                                *)&local_12e8,local_1388);
        local_1588.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)((double)CONCAT44(iStack_1564,local_1568) * local_1448);
        local_1588.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)((double)pOStack_1560 * local_1448);
        std::complex<double>::operator*=((complex<double> *)&local_1588,pmVar10);
        local_1568 = (int)local_1588.bitsets_.
                          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                          ._M_impl.super__Vector_impl_data._M_start;
        iStack_1564 = (int)((ulong)local_1588.bitsets_.
                                   super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 0x20);
        pOStack_1560 = local_1588.bitsets_.
                       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
        local_1508 = (key_type)((ulong)((int)uVar25 - uVar22) << 0x20 | (ulong)dVar27);
        pmVar10 = std::
                  map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                  ::operator[]((map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                                *)&local_12e8,&local_1508);
        local_1588.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_start._4_4_ = iStack_1564;
        local_1588.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = local_1568;
        local_1588.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_finish = pOStack_1560;
        std::complex<double>::operator*=((complex<double> *)&local_1588,pmVar10);
        pdVar2 = (double *)
                 ((long)(local_1488.
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_value + (long)local_1518);
        dVar27 = pdVar2[1];
        pdVar3 = (double *)
                 ((long)(local_1488.
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_value + (long)local_1518);
        *pdVar3 = *pdVar2 + (double)local_1588.bitsets_.
                                    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
        pdVar3[1] = dVar27 + (double)local_1588.bitsets_.
                                     super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                     ._M_impl.super__Vector_impl_data._M_finish;
        lVar18 = lVar18 + 1;
        uVar25 = (ulong)((int)uVar25 - 1);
        pmVar21 = (map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                   *)local_1510;
      }
      uVar22 = (int)local_14b8 + 1;
      uVar25 = (ulong)((int)local_1548 - 1);
    } while (uVar22 != local_158c);
    auVar30._0_8_ =
         pow(local_14f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[(long)local_1570],1.5);
    auVar30._8_8_ = auVar30._0_8_;
    auVar28 = divpd(*(undefined1 (*) [16])((long)pcVar8->_M_value + (long)local_1518),auVar30);
    *(undefined1 (*) [16])
     ((long)(local_1438.
             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start)->_M_value + (long)local_1518) = auVar28;
    uVar26 = (long)local_1570 + 1;
    local_158c = local_158c + 1;
  } while (uVar26 != 0xd);
  std::vector<double,_std::allocator<double>_>::vector(&local_1340,&local_1418);
  this_00 = local_1520;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&local_1358,&local_1438);
  writeOrderParameter(this_00,&local_1340,&local_1358);
  if (local_1358.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1358.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1358.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1358.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1340.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_1340.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1340.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1340.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  DumpReader::~DumpReader(&local_1288);
  if (local_1438.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1438.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1438.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1438.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1488.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1488.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1488.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1488.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1418.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_1418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_14f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_14f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_14f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_14f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_std::complex<double>_>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
  ::~_Rb_tree(&local_12e8);
  if (local_13f8.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_13f8.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_13f8.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_13f8.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1468.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1468.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1468.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1468.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_14d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_14d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_14d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_14d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_13d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_13d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_13d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_13d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_std::complex<double>_>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
  ::~_Rb_tree(&local_12b8);
  return;
}

Assistant:

void BondOrderParameter::process() {
    Molecule* mol;
    Atom* atom;
    int myIndex;
    SimInfo::MoleculeIterator mi;
    Molecule::AtomIterator ai;
    StuntDouble* sd;
    Vector3d vec;
    RealType costheta;
    RealType phi;
    RealType r;
    std::map<std::pair<int, int>, ComplexType> q;
    std::vector<RealType> q_l;
    std::vector<RealType> q2;
    std::vector<ComplexType> w;
    std::vector<ComplexType> w_hat;
    std::map<std::pair<int, int>, ComplexType> QBar;
    std::vector<RealType> Q2;
    std::vector<RealType> Q;
    std::vector<ComplexType> W;
    std::vector<ComplexType> W_hat;
    int nBonds, Nbonds;
    SphericalHarmonic sphericalHarmonic;
    int i;
    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    DumpReader reader(info_, dumpFilename_);
    int nFrames   = reader.getNFrames();
    frameCounter_ = 0;

    q_l.resize(lMax_ + 1);
    q2.resize(lMax_ + 1);
    w.resize(lMax_ + 1);
    w_hat.resize(lMax_ + 1);

    Q2.resize(lMax_ + 1);
    Q.resize(lMax_ + 1);
    W.resize(lMax_ + 1);
    W_hat.resize(lMax_ + 1);
    Nbonds = 0;

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      frameCounter_++;
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      if (evaluator_.isDynamic()) {
        seleMan_.setSelectionSet(evaluator_.evaluate());
      }

      // outer loop is over the selected StuntDoubles:

      for (sd = seleMan_.beginSelected(i); sd != NULL;
           sd = seleMan_.nextSelected(i)) {
        myIndex = sd->getGlobalIndex();
        nBonds  = 0;

        for (int l = 0; l <= lMax_; l++) {
          for (int m = -l; m <= l; m++) {
            q[std::make_pair(l, m)] = 0.0;
          }
        }

        // inner loop is over all other atoms in the system:

        for (mol = info_->beginMolecule(mi); mol != NULL;
             mol = info_->nextMolecule(mi)) {
          for (atom = mol->beginAtom(ai); atom != NULL;
               atom = mol->nextAtom(ai)) {
            if (atom->getGlobalIndex() != myIndex) {
              vec = sd->getPos() - atom->getPos();

              if (usePeriodicBoundaryConditions_)
                currentSnapshot_->wrapVector(vec);

              // Calculate "bonds" and build Q_lm(r) where
              //      Q_lm = Y_lm(theta(r),phi(r))
              // The spherical harmonics are wrt any arbitrary coordinate
              // system, we choose standard spherical coordinates

              r = vec.length();

              // Check to see if neighbor is in bond cutoff

              if (r < rCut_) {
                costheta = vec.z() / r;
                phi      = atan2(vec.y(), vec.x());

                for (int l = 0; l <= lMax_; l++) {
                  sphericalHarmonic.setL(l);
                  for (int m = -l; m <= l; m++) {
                    sphericalHarmonic.setM(m);
                    q[std::make_pair(l, m)] +=
                        sphericalHarmonic.getValueAt(costheta, phi);
                  }
                }
                nBonds++;
              }
            }
          }
        }

        for (int l = 0; l <= lMax_; l++) {
          q2[l] = 0.0;
          for (int m = -l; m <= l; m++) {
            q[std::make_pair(l, m)] /= (RealType)nBonds;

            q2[l] += norm(q[std::make_pair(l, m)]);
          }
          q_l[l] = sqrt(q2[l] * 4.0 * Constants::PI / (RealType)(2 * l + 1));
        }

        // Find Third Order Invariant W_l

        for (int l = 0; l <= lMax_; l++) {
          w[l] = 0.0;
          for (int m1 = -l; m1 <= l; m1++) {
            std::pair<int, int> lm = std::make_pair(l, m1);
            for (int mmm = 0; mmm <= (m2Max[lm] - m2Min[lm]); mmm++) {
              int m2 = m2Min[lm] + mmm;
              int m3 = -m1 - m2;
              w[l] += w3j[lm][mmm] * q[lm] * q[std::make_pair(l, m2)] *
                      q[std::make_pair(l, m3)];
            }
          }

          w_hat[l] = w[l] / pow(q2[l], RealType(1.5));
        }

        collectHistogram(q_l, w_hat);

        Nbonds += nBonds;
        for (int l = 0; l <= lMax_; l++) {
          for (int m = -l; m <= l; m++) {
            QBar[std::make_pair(l, m)] +=
                (RealType)nBonds * q[std::make_pair(l, m)];
          }
        }
      }
    }

    // Normalize Qbar2
    for (int l = 0; l <= lMax_; l++) {
      for (int m = -l; m <= l; m++) {
        QBar[std::make_pair(l, m)] /= Nbonds;
      }
    }

    // Find second order invariant Q_l

    for (int l = 0; l <= lMax_; l++) {
      Q2[l] = 0.0;
      for (int m = -l; m <= l; m++) {
        Q2[l] += norm(QBar[std::make_pair(l, m)]);
      }
      Q[l] = sqrt(Q2[l] * 4.0 * Constants::PI / (RealType)(2 * l + 1));
    }

    // Find Third Order Invariant W_l

    for (int l = 0; l <= lMax_; l++) {
      W[l] = 0.0;
      for (int m1 = -l; m1 <= l; m1++) {
        std::pair<int, int> lm = std::make_pair(l, m1);
        for (int mmm = 0; mmm <= (m2Max[lm] - m2Min[lm]); mmm++) {
          int m2 = m2Min[lm] + mmm;
          int m3 = -m1 - m2;
          W[l] += w3j[lm][mmm] * QBar[lm] * QBar[std::make_pair(l, m2)] *
                  QBar[std::make_pair(l, m3)];
        }
      }

      W_hat[l] = W[l] / pow(Q2[l], RealType(1.5));
    }

    writeOrderParameter(Q, W_hat);
  }